

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&>
               (string *s,char *fmt,bool *v,bool *args,bool *args_1,bool *args_2,bool *args_3,
               bool *args_4,bool *args_5,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_7,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_8,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_9,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_10,
               optional<pbrt::Bounds2<float>_> *args_11,optional<pbrt::Bounds2<int>_> *args_12)

{
  long lVar1;
  ulong uVar2;
  byte *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_RBP;
  char *pcVar3;
  string *in_RDI;
  string *in_R9;
  bool *unaff_R13;
  bool *unaff_R14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_R15;
  byte bVar4;
  byte bVar5;
  undefined1 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  string *in_stack_00000018;
  optional<pbrt::Bounds2<int>_> *in_stack_00000020;
  string *in_stack_00000028;
  bool *in_stack_00000038;
  bool *in_stack_00000040;
  bool *in_stack_00000048;
  bool *in_stack_00000050;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string *in_stack_fffffffffffffce0;
  char **in_stack_fffffffffffffce8;
  char **in_stack_fffffffffffffcf0;
  char *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  undefined1 *puVar7;
  optional<pbrt::Bounds2<float>_> *in_stack_fffffffffffffd38;
  char *in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd64;
  char *in_stack_fffffffffffffd68;
  LogLevel in_stack_fffffffffffffd74;
  string local_288 [32];
  undefined8 local_268;
  string local_260 [32];
  stringstream local_240 [16];
  undefined1 local_230 [376];
  string local_b8 [32];
  undefined4 local_98;
  undefined5 in_stack_ffffffffffffff78;
  bool *in_stack_ffffffffffffff80;
  bool *in_stack_ffffffffffffff88;
  bool *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  
  copyToFormatString(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffff80,0x2a);
  bVar4 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffff80,0x73);
  bVar5 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffff80,100);
  uVar6 = lVar1 != -1;
  if ((bVar4 & 1) == 0) {
    if ((bVar5 & 1) == 0) {
      if ((bool)uVar6) {
        puVar7 = &stack0xffffffffffffff80;
        uVar2 = std::__cxx11::string::find((char)puVar7,100);
        IntegerFormatTrait<bool>::fmt();
        std::__cxx11::string::replace((ulong)puVar7,uVar2,(char *)0x1);
        std::__cxx11::string::c_str();
        formatOne<bool_const&>(in_stack_fffffffffffffcf8,(bool *)in_stack_fffffffffffffcf0);
        std::__cxx11::string::operator+=(in_RDI,local_b8);
        std::__cxx11::string::~string(local_b8);
      }
      else if ((bVar5 & 1) == 0) {
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) != 0) {
          LogFatal(in_stack_fffffffffffffd74,in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,
                   in_stack_fffffffffffffd58);
        }
        std::__cxx11::string::c_str();
        formatOne<bool_const&>(in_stack_fffffffffffffcf8,(bool *)in_stack_fffffffffffffcf0);
        std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd58);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffd58);
      }
      else {
        std::__cxx11::stringstream::stringstream(local_240);
        std::ostream::operator<<(local_230,(bool)(*in_RDX & 1));
        std::__cxx11::string::c_str();
        std::__cxx11::stringstream::str();
        local_268 = std::__cxx11::string::c_str();
        formatOne<char_const*>(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
        std::__cxx11::string::operator+=(in_RDI,local_260);
        std::__cxx11::string::~string(local_260);
        std::__cxx11::string::~string(local_288);
        std::__cxx11::stringstream::~stringstream(local_240);
      }
    }
    else {
      pcVar3 = "false";
      if ((*in_RDX & 1) != 0) {
        pcVar3 = "true";
      }
      std::__cxx11::string::operator+=(in_RDI,pcVar3);
    }
    stringPrintfRecursive<bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&>
              (in_R9,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,
               (bool *)CONCAT17(bVar4,CONCAT16(bVar5,CONCAT15(uVar6,in_stack_ffffffffffffff78))),
               unaff_R13,unaff_R14,unaff_R15,unaff_RBP,unaff_retaddr,in_stack_00000008,
               in_stack_00000010,(optional<pbrt::Bounds2<float>_> *)in_stack_00000018,
               in_stack_00000020);
    local_98 = 0;
  }
  else {
    stringPrintfRecursiveWithPrecision<bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&>
              (in_stack_00000028,(char *)in_stack_00000020,in_stack_00000018,
               (bool *)in_stack_00000010,(bool *)in_stack_00000008,(bool *)in_R9,in_stack_00000038,
               in_stack_00000040,in_stack_00000048,in_stack_00000050,in_stack_fffffffffffffd10,
               in_stack_fffffffffffffd18,in_stack_fffffffffffffd20,in_stack_fffffffffffffd28,
               in_stack_fffffffffffffd30,in_stack_fffffffffffffd38,
               (optional<pbrt::Bounds2<int>_> *)&stack0xfffffffffffffcb8);
    local_98 = 1;
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}